

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O1

REF_STATUS ref_layer_attach(REF_LAYER ref_layer,REF_GRID_conflict ref_grid,REF_INT faceid)

{
  REF_CELL ref_cell;
  REF_STATUS RVar1;
  uint uVar2;
  int cell;
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  if (0 < ref_cell->max) {
    cell = 0;
    do {
      RVar1 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (((RVar1 == 0) && (local_a8[ref_cell->node_per] == faceid)) &&
         (uVar2 = ref_list_push(ref_layer->ref_list,cell), uVar2 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x4a,"ref_layer_attach",(ulong)uVar2,"parent");
        return uVar2;
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_layer_attach(REF_LAYER ref_layer, REF_GRID ref_grid,
                                    REF_INT faceid) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];

  /* copy nodes into local copy that provides compact index */
  each_ref_cell_valid_cell_with_nodes(
      ref_cell, cell, nodes) if (faceid == nodes[ref_cell_node_per(ref_cell)])
      RSS(ref_list_push(ref_layer_list(ref_layer), cell), "parent");

  return REF_SUCCESS;
}